

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

bool_t memEq(void *buf1,void *buf2,size_t count)

{
  ulong uVar1;
  word diff;
  
  diff = 0;
  for (; 7 < count; count = count - 8) {
    diff = diff | *buf2 ^ *buf1;
    buf1 = (void *)((long)buf1 + 8);
    buf2 = (void *)((long)buf2 + 8);
  }
  for (uVar1 = 0; count != uVar1; uVar1 = uVar1 + 1) {
    diff = diff | *(byte *)((long)buf2 + uVar1) ^ *(byte *)((long)buf1 + uVar1);
  }
  return (bool_t)(diff == 0);
}

Assistant:

bool_t SAFE(memEq)(const void* buf1, const void* buf2, size_t count)
{
	register word diff = 0;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		diff |= *(const word*)buf1 ^ *(const word*)buf2;
		buf1 = (const word*)buf1 + 1;
		buf2 = (const word*)buf2 + 1;
	}
	while (count--)
	{
		diff |= *(const octet*)buf1 ^ *(const octet*)buf2;
		buf1 = (const octet*)buf1 + 1;
		buf2 = (const octet*)buf2 + 1;
	}
	return wordEq(diff, 0);
}